

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  int iVar1;
  float *pfVar2;
  unsigned_short *ptr;
  float *pfVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImFontGlyph *pIVar10;
  ulong uVar11;
  ImFontGlyph *pIVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  int n;
  long lVar16;
  ushort uVar17;
  int iVar18;
  int iVar19;
  float fVar20;
  ImWchar dots_chars [2];
  ImWchar ellipsis_chars [2];
  ushort local_30 [4];
  
  uVar11 = (ulong)(uint)(this->Glyphs).Size;
  if (uVar11 == 0) {
    uVar15 = 1;
  }
  else {
    lVar13 = 0;
    uVar15 = 0;
    do {
      uVar14 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar13) >> 2;
      if (uVar14 < uVar15) {
        uVar14 = uVar15;
      }
      uVar15 = uVar14;
      lVar13 = lVar13 + 0x28;
    } while (uVar11 * 0x28 != lVar13);
    uVar15 = uVar15 + 1;
  }
  pfVar2 = (this->IndexAdvanceX).Data;
  if (pfVar2 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar2);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  ptr = (this->IndexLookup).Data;
  if (ptr != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar15);
  iVar18 = (this->Glyphs).Size;
  if (0 < iVar18) {
    lVar13 = 4;
    lVar16 = 0;
    do {
      pIVar12 = (this->Glyphs).Data;
      uVar14 = *(uint *)((long)pIVar12 + lVar13 + -4);
      *(undefined4 *)((long)(this->IndexAdvanceX).Data + (ulong)(uVar14 & 0xfffffffc)) =
           *(undefined4 *)(&pIVar12->field_0x0 + lVar13);
      (this->IndexLookup).Data[uVar14 >> 2] = (unsigned_short)lVar16;
      this->Used4kPagesMap[uVar14 >> 0x11] =
           this->Used4kPagesMap[uVar14 >> 0x11] | (byte)(1 << ((byte)(uVar14 >> 0xe) & 7));
      lVar16 = lVar16 + 1;
      iVar18 = (this->Glyphs).Size;
      lVar13 = lVar13 + 0x28;
    } while (lVar16 < iVar18);
  }
  if (((uint)(this->IndexLookup).Size < 0x21) ||
     (uVar17 = (this->IndexLookup).Data[0x20], uVar17 == 0xffff)) {
    pIVar12 = this->FallbackGlyph;
  }
  else {
    pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
  }
  if (pIVar12 != (ImFontGlyph *)0x0) {
    if (((undefined1  [40])(this->Glyphs).Data[(long)iVar18 + -1] & (undefined1  [40])0xfffffffc) !=
        (undefined1  [40])0x24) {
      iVar19 = iVar18 + 1;
      iVar1 = (this->Glyphs).Capacity;
      if (iVar1 <= iVar18) {
        if (iVar1 == 0) {
          iVar18 = 8;
        }
        else {
          iVar18 = iVar1 / 2 + iVar1;
        }
        if (iVar18 <= iVar19) {
          iVar18 = iVar19;
        }
        if (iVar1 < iVar18) {
          pIVar10 = (ImFontGlyph *)ImGui::MemAlloc((long)iVar18 * 0x28);
          pIVar12 = (this->Glyphs).Data;
          if (pIVar12 != (ImFontGlyph *)0x0) {
            memcpy(pIVar10,pIVar12,(long)(this->Glyphs).Size * 0x28);
            ImGui::MemFree((this->Glyphs).Data);
          }
          (this->Glyphs).Data = pIVar10;
          (this->Glyphs).Capacity = iVar18;
        }
      }
      (this->Glyphs).Size = iVar19;
    }
    pIVar12 = (this->Glyphs).Data;
    iVar18 = (this->Glyphs).Size;
    if (((uint)(this->IndexLookup).Size < 0x21) ||
       (uVar17 = (this->IndexLookup).Data[0x20], uVar17 == 0xffff)) {
      pIVar10 = this->FallbackGlyph;
    }
    else {
      pIVar10 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
    }
    fVar20 = pIVar10->V1;
    pIVar12[(long)iVar18 + -1].U1 = pIVar10->U1;
    pIVar12[(long)iVar18 + -1].V1 = fVar20;
    uVar6 = *(undefined4 *)&pIVar10->field_0x0;
    fVar7 = pIVar10->AdvanceX;
    fVar8 = pIVar10->X0;
    fVar9 = pIVar10->Y0;
    fVar20 = pIVar10->Y1;
    fVar4 = pIVar10->U0;
    fVar5 = pIVar10->V0;
    pIVar12[(long)iVar18 + -1].X1 = pIVar10->X1;
    pIVar12[(long)iVar18 + -1].Y1 = fVar20;
    pIVar12[(long)iVar18 + -1].U0 = fVar4;
    pIVar12[(long)iVar18 + -1].V0 = fVar5;
    *(undefined4 *)&pIVar12[(long)iVar18 + -1].field_0x0 = uVar6;
    pIVar12[(long)iVar18 + -1].AdvanceX = fVar7;
    pIVar12[(long)iVar18 + -1].X0 = fVar8;
    pIVar12[(long)iVar18 + -1].Y0 = fVar9;
    *(uint *)(pIVar12 + (long)iVar18 + -1) = *(uint *)(pIVar12 + (long)iVar18 + -1) & 3 | 0x24;
    fVar20 = pIVar12[(long)iVar18 + -1].AdvanceX * 4.0;
    pIVar12[(long)iVar18 + -1].AdvanceX = fVar20;
    (this->IndexAdvanceX).Data[9] = fVar20;
    (this->IndexLookup).Data[*(uint *)(pIVar12 + (long)iVar18 + -1) >> 2] =
         (short)(this->Glyphs).Size - 1;
  }
  if (((uint)(this->IndexLookup).Size < 0x21) ||
     (uVar17 = (this->IndexLookup).Data[0x20], uVar17 == 0xffff)) {
    pIVar12 = this->FallbackGlyph;
  }
  else {
    pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
  }
  if (pIVar12 != (ImFontGlyph *)0x0) {
    *(byte *)pIVar12 = *(byte *)pIVar12 & 0xfd;
  }
  if (((uint)(this->IndexLookup).Size < 10) ||
     (uVar17 = (this->IndexLookup).Data[9], uVar17 == 0xffff)) {
    pIVar12 = this->FallbackGlyph;
  }
  else {
    pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
  }
  if (pIVar12 != (ImFontGlyph *)0x0) {
    *(byte *)pIVar12 = *(byte *)pIVar12 & 0xfd;
  }
  local_30[2] = 0x2026;
  local_30[3] = 0x85;
  local_30[0] = 0x2e;
  local_30[1] = 0xff0e;
  if (this->EllipsisChar == 0xffff) {
    lVar13 = 0;
    do {
      uVar17 = local_30[lVar13 + 2];
      if ((((ulong)uVar17 < (ulong)(long)(this->IndexLookup).Size) &&
          ((this->IndexLookup).Data[uVar17] != 0xffff)) &&
         ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_0020a5a7;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 2);
    uVar17 = 0xffff;
LAB_0020a5a7:
    this->EllipsisChar = uVar17;
  }
  if (this->DotChar == 0xffff) {
    lVar13 = 0;
    do {
      uVar17 = local_30[lVar13];
      if ((((ulong)uVar17 < (ulong)(long)(this->IndexLookup).Size) &&
          ((this->IndexLookup).Data[uVar17] != 0xffff)) &&
         ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_0020a5e8;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 2);
    uVar17 = 0xffff;
LAB_0020a5e8:
    this->DotChar = uVar17;
  }
  uVar11 = (ulong)(this->IndexLookup).Size;
  if (this->FallbackChar < uVar11) {
    uVar17 = (this->IndexLookup).Data[this->FallbackChar];
    pIVar12 = (ImFontGlyph *)0x0;
    if (uVar17 != 0xffff) {
      pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
    }
  }
  else {
    pIVar12 = (ImFontGlyph *)0x0;
  }
  this->FallbackGlyph = pIVar12;
  if (pIVar12 == (ImFontGlyph *)0x0) {
    lVar13 = 0;
    do {
      uVar17 = *(ushort *)((long)&DAT_0025ad32 + lVar13);
      if (((uVar17 < uVar11) && ((this->IndexLookup).Data[uVar17] != 0xffff)) &&
         ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_0020a665;
      lVar13 = lVar13 + 2;
    } while (lVar13 != 6);
    uVar17 = 0xffff;
LAB_0020a665:
    this->FallbackChar = uVar17;
    if (uVar17 < uVar11) {
      uVar17 = (this->IndexLookup).Data[uVar17];
      pIVar12 = (ImFontGlyph *)0x0;
      if (uVar17 != 0xffff) {
        pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
      }
    }
    else {
      pIVar12 = (ImFontGlyph *)0x0;
    }
    this->FallbackGlyph = pIVar12;
    if (pIVar12 == (ImFontGlyph *)0x0) {
      pIVar12 = (this->Glyphs).Data + (long)(this->Glyphs).Size + -1;
      this->FallbackGlyph = pIVar12;
      this->FallbackChar = (ImWchar)(*(uint *)pIVar12 >> 2);
    }
  }
  this->FallbackAdvanceX = this->FallbackGlyph->AdvanceX;
  uVar11 = 0;
  do {
    pfVar3 = (this->IndexAdvanceX).Data;
    pfVar2 = pfVar3 + uVar11;
    if (*pfVar2 <= 0.0 && *pfVar2 != 0.0) {
      pfVar3[uVar11] = this->FallbackAdvanceX;
    }
    uVar11 = uVar11 + 1;
  } while (uVar15 != uVar11);
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Note that 0x2026 is rarely included in our font ranges. Because of this we are more likely to use three individual dots.
    const ImWchar ellipsis_chars[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
    const ImWchar dots_chars[] = { (ImWchar)'.', (ImWchar)0xFF0E };
    if (EllipsisChar == (ImWchar)-1)
        EllipsisChar = FindFirstExistingGlyph(this, ellipsis_chars, IM_ARRAYSIZE(ellipsis_chars));
    if (DotChar == (ImWchar)-1)
        DotChar = FindFirstExistingGlyph(this, dots_chars, IM_ARRAYSIZE(dots_chars));

    // Setup fallback character
    const ImWchar fallback_chars[] = { (ImWchar)IM_UNICODE_CODEPOINT_INVALID, (ImWchar)'?', (ImWchar)' ' };
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    if (FallbackGlyph == NULL)
    {
        FallbackChar = FindFirstExistingGlyph(this, fallback_chars, IM_ARRAYSIZE(fallback_chars));
        FallbackGlyph = FindGlyphNoFallback(FallbackChar);
        if (FallbackGlyph == NULL)
        {
            FallbackGlyph = &Glyphs.back();
            FallbackChar = (ImWchar)FallbackGlyph->Codepoint;
        }
    }

    FallbackAdvanceX = FallbackGlyph->AdvanceX;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}